

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu511.c
# Opt level: O3

MPP_RET hal_h265e_vepu511_init(void *hal,MppEncHalCfg *cfg)

{
  MppEncCfgSet *pMVar1;
  int iVar2;
  MPP_RET MVar3;
  undefined8 in_RAX;
  void *pvVar4;
  void *pvVar5;
  char *fname;
  char *fmt;
  long lVar6;
  ulong uVar7;
  undefined4 uVar8;
  
  uVar8 = (undefined4)((ulong)in_RAX >> 0x20);
  mpp_env_get_u32("hal_h265e_debug",&hal_h265e_debug,0);
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) enter\n",(char *)0x0,0x1fb);
  }
  iVar2 = cfg->task_cnt;
  *(int *)((long)hal + 0xb4) = iVar2;
  if (iVar2 == 0 || 2 < iVar2) {
    _mpp_log_l(2,"hal_h265e_v511","Assertion %s failed at %s:%d\n",(char *)0x0,
               "ctx->task_cnt && ctx->task_cnt <= 2","hal_h265e_vepu511_init",CONCAT44(uVar8,0x1fe))
    ;
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
    iVar2 = *(int *)((long)hal + 0xb4);
    if (iVar2 < 3) goto LAB_0025e583;
    *(undefined4 *)((long)hal + 0xb4) = 2;
  }
  else {
LAB_0025e583:
    if (iVar2 < 1) goto LAB_0025e5e1;
  }
  lVar6 = 0;
  do {
    pvVar4 = mpp_osal_calloc("hal_h265e_vepu511_init",0x1a0);
    pvVar5 = mpp_osal_calloc("hal_h265e_vepu511_init",0x18d0);
    *(void **)((long)pvVar4 + 0x18) = pvVar5;
    pvVar5 = mpp_osal_calloc("hal_h265e_vepu511_init",0x254);
    *(void **)((long)pvVar4 + 0x20) = pvVar5;
    *(undefined4 *)((long)pvVar4 + 4) = 2;
    *(void **)((long)hal + lVar6 * 8 + 0x80) = pvVar4;
    lVar6 = lVar6 + 1;
  } while (lVar6 < *(int *)((long)hal + 0xb4));
LAB_0025e5e1:
  pvVar4 = mpp_osal_calloc("hal_h265e_vepu511_init",0x28);
  *(void **)((long)hal + 0x3e0) = pvVar4;
  *(MppEncCfgSet **)((long)hal + 0x3b0) = cfg->cfg;
  hal_bufs_init((HalBufs *)((long)hal + 0x400));
  *(undefined4 *)((long)hal + 0xb0) = 0xffffffff;
  *(undefined4 *)((long)hal + 0x370) = 0;
  *(undefined4 *)((long)hal + 0x3d0) = 1;
  cfg->cap_recn_out = 1;
  cfg->type = VPU_CLIENT_RKVENC;
  MVar3 = mpp_dev_init(&cfg->dev,VPU_CLIENT_RKVENC);
  if (MVar3 == MPP_OK) {
    mpp_dev_multi_offset_init((MppDevRegOffCfgs **)((long)hal + 0x3b8),0x18);
    *(MppDev *)((long)hal + 0x68) = cfg->dev;
    *(undefined4 *)((long)hal + 0x374) = 2;
    pMVar1 = cfg->cfg;
    (pMVar1->hw).qp_delta_row = 2;
    (pMVar1->hw).qp_delta_row_i = 2;
    (pMVar1->hw).qbias_i = 0xab;
    (pMVar1->hw).qbias_p = 0x55;
    (pMVar1->hw).qbias_en = 0;
    (pMVar1->hw).mode_bias[0] = 8;
    (pMVar1->hw).mode_bias[1] = 8;
    (pMVar1->hw).mode_bias[2] = 8;
    (pMVar1->hw).mode_bias[3] = 8;
    (pMVar1->hw).mode_bias[4] = 8;
    (pMVar1->hw).mode_bias[5] = 8;
    (pMVar1->hw).mode_bias[6] = 8;
    (pMVar1->hw).mode_bias[7] = 8;
    *(undefined8 *)((long)hal + 0x98) = 0x5000000008;
    pvVar4 = mpp_osal_malloc("hal_h265e_vepu511_init",0x50);
    *(void **)((long)hal + 0xa0) = pvVar4;
    if (pvVar4 == (void *)0x0) {
      _mpp_log_l(2,"hal_h265e_v511","init poll cfg buffer failed\n","hal_h265e_vepu511_init");
      hal_h265e_vepu511_deinit(hal);
      MVar3 = MPP_ERR_MALLOC;
    }
    else {
      *(MppCbCtx **)((long)hal + 0xa8) = cfg->output_cb;
      cfg->cap_recn_out = 1;
      MVar3 = MPP_OK;
    }
    if (((byte)hal_h265e_debug & 4) == 0) {
      return MVar3;
    }
    fmt = "(%d) leave\n";
    iVar2 = 4;
    fname = (char *)0x0;
    uVar7 = 0x23e;
  }
  else {
    fmt = "mpp_dev_init failed. ret: %d\n";
    fname = "hal_h265e_vepu511_init";
    iVar2 = 2;
    uVar7 = (ulong)(uint)MVar3;
  }
  _mpp_log_l(iVar2,"hal_h265e_v511",fmt,fname,uVar7);
  return MVar3;
}

Assistant:

MPP_RET hal_h265e_vepu511_init(void *hal, MppEncHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    H265eV511HalContext *ctx = (H265eV511HalContext *)hal;
    RK_S32 i = 0;

    mpp_env_get_u32("hal_h265e_debug", &hal_h265e_debug, 0);
    hal_h265e_enter();

    ctx->task_cnt = cfg->task_cnt;
    mpp_assert(ctx->task_cnt && ctx->task_cnt <= MAX_FRAME_TASK_NUM);
    if (ctx->task_cnt > MAX_FRAME_TASK_NUM)
        ctx->task_cnt = MAX_FRAME_TASK_NUM;

    for (i = 0; i < ctx->task_cnt; i++) {
        Vepu511H265eFrmCfg *frm_cfg = mpp_calloc(Vepu511H265eFrmCfg, 1);

        frm_cfg->regs_set = mpp_calloc(H265eV511RegSet, 1);
        frm_cfg->regs_ret = mpp_calloc(H265eV511StatusElem, 1);
        frm_cfg->frame_type = INTRA_FRAME;
        ctx->frms[i] = frm_cfg;
    }

    ctx->input_fmt      = mpp_calloc(VepuFmtCfg, 1);
    ctx->cfg            = cfg->cfg;
    hal_bufs_init(&ctx->dpb_bufs);

    ctx->frame_count = -1;
    ctx->frame_cnt_gen_ready = 0;
    ctx->enc_mode = 1;
    cfg->cap_recn_out = 1;
    cfg->type = VPU_CLIENT_RKVENC;
    ret = mpp_dev_init(&cfg->dev, cfg->type);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        return ret;
    }
    mpp_dev_multi_offset_init(&ctx->reg_cfg, 24);
    ctx->dev = cfg->dev;
    ctx->frame_type = INTRA_FRAME;

    {   /* setup default hardware config */
        MppEncHwCfg *hw = &cfg->cfg->hw;
        RK_U32 j;

        hw->qp_delta_row_i  = 2;
        hw->qp_delta_row    = 2;
        hw->qbias_i         = 171;
        hw->qbias_p         = 85;
        hw->qbias_en        = 0;

        for (j = 0; j < MPP_ARRAY_ELEMS(hw->mode_bias); j++)
            hw->mode_bias[j] = 8;
    }

    ctx->poll_slice_max = 8;
    ctx->poll_cfg_size = (sizeof(ctx->poll_cfgs) + sizeof(RK_S32) * ctx->poll_slice_max) * 2;
    ctx->poll_cfgs = mpp_malloc_size(MppDevPollCfg, ctx->poll_cfg_size);

    if (NULL == ctx->poll_cfgs) {
        ret = MPP_ERR_MALLOC;
        mpp_err_f("init poll cfg buffer failed\n");
        goto DONE;
    }

    ctx->output_cb = cfg->output_cb;
    cfg->cap_recn_out = 1;

    // ctx->tune = vepu511_h265e_tune_init(ctx);

DONE:
    if (ret)
        hal_h265e_vepu511_deinit(hal);

    hal_h265e_leave();
    return ret;
}